

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O2

void convert_32s1u_C1R(OPJ_INT32 *pSrc,OPJ_BYTE *pDst,OPJ_SIZE_T length)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  OPJ_INT32 OVar5;
  ulong uVar6;
  OPJ_INT32 OVar7;
  OPJ_INT32 OVar8;
  
  for (uVar6 = 0; uVar6 < (length & 0xfffffffffffffff8); uVar6 = uVar6 + 8) {
    *pDst = (char)pSrc[uVar6 + 6] * '\x02' |
            (byte)(pSrc[uVar6 + 5] << 2) | (byte)(pSrc[uVar6 + 4] << 3) |
            (byte)(pSrc[uVar6 + 3] << 4) | (byte)(pSrc[uVar6 + 2] << 5) |
            (byte)(pSrc[uVar6 + 1] << 6) | (byte)(pSrc[uVar6] << 7) | (byte)pSrc[uVar6 + 7];
    pDst = pDst + 1;
  }
  if ((length & 7) == 0) {
    return;
  }
  bVar1 = 0;
  uVar2 = (uint)(length & 7);
  if (uVar2 == 1) {
    OVar5 = 0;
LAB_00106854:
    OVar7 = 0;
LAB_00106857:
    OVar8 = 0;
LAB_0010685a:
    iVar3 = 0;
  }
  else {
    OVar5 = pSrc[uVar6 + 1];
    if (uVar2 < 3) goto LAB_00106854;
    OVar7 = pSrc[uVar6 + 2];
    if (uVar2 == 3) goto LAB_00106857;
    OVar8 = pSrc[uVar6 + 3];
    if (uVar2 < 5) goto LAB_0010685a;
    iVar3 = pSrc[uVar6 + 4];
    if (uVar2 != 5) {
      iVar4 = pSrc[uVar6 + 5];
      if (uVar2 == 7) {
        bVar1 = (char)pSrc[uVar6 + 6] * '\x02';
      }
      goto LAB_0010685e;
    }
  }
  iVar4 = 0;
LAB_0010685e:
  *pDst = (byte)(iVar4 << 2) |
          (byte)(iVar3 << 3) | (byte)(OVar8 << 4) | (byte)(OVar7 << 5) | (byte)(OVar5 << 6) |
          (byte)(pSrc[uVar6] << 7) | bVar1;
  return;
}

Assistant:

static void convert_32s1u_C1R(const OPJ_INT32* pSrc, OPJ_BYTE* pDst,
                              OPJ_SIZE_T length)
{
    OPJ_SIZE_T i;
    for (i = 0; i < (length & ~(OPJ_SIZE_T)7U); i += 8U) {
        OPJ_UINT32 src0 = (OPJ_UINT32)pSrc[i + 0];
        OPJ_UINT32 src1 = (OPJ_UINT32)pSrc[i + 1];
        OPJ_UINT32 src2 = (OPJ_UINT32)pSrc[i + 2];
        OPJ_UINT32 src3 = (OPJ_UINT32)pSrc[i + 3];
        OPJ_UINT32 src4 = (OPJ_UINT32)pSrc[i + 4];
        OPJ_UINT32 src5 = (OPJ_UINT32)pSrc[i + 5];
        OPJ_UINT32 src6 = (OPJ_UINT32)pSrc[i + 6];
        OPJ_UINT32 src7 = (OPJ_UINT32)pSrc[i + 7];

        *pDst++ = (OPJ_BYTE)((src0 << 7) | (src1 << 6) | (src2 << 5) | (src3 << 4) |
                             (src4 << 3) | (src5 << 2) | (src6 << 1) | src7);
    }

    if (length & 7U) {
        OPJ_UINT32 src0 = (OPJ_UINT32)pSrc[i + 0];
        OPJ_UINT32 src1 = 0U;
        OPJ_UINT32 src2 = 0U;
        OPJ_UINT32 src3 = 0U;
        OPJ_UINT32 src4 = 0U;
        OPJ_UINT32 src5 = 0U;
        OPJ_UINT32 src6 = 0U;
        length = length & 7U;

        if (length > 1U) {
            src1 = (OPJ_UINT32)pSrc[i + 1];
            if (length > 2U) {
                src2 = (OPJ_UINT32)pSrc[i + 2];
                if (length > 3U) {
                    src3 = (OPJ_UINT32)pSrc[i + 3];
                    if (length > 4U) {
                        src4 = (OPJ_UINT32)pSrc[i + 4];
                        if (length > 5U) {
                            src5 = (OPJ_UINT32)pSrc[i + 5];
                            if (length > 6U) {
                                src6 = (OPJ_UINT32)pSrc[i + 6];
                            }
                        }
                    }
                }
            }
        }
        *pDst++ = (OPJ_BYTE)((src0 << 7) | (src1 << 6) | (src2 << 5) | (src3 << 4) |
                             (src4 << 3) | (src5 << 2) | (src6 << 1));
    }
}